

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O0

void __thiscall fmp4_stream::trun::zero_set(trun *this)

{
  trun *this_local;
  
  *(undefined4 *)&(this->super_full_box).field_0x6c = 0;
  this->data_offset_ = 0;
  this->first_sample_flags_ = 0;
  this->data_offset_present_ = false;
  this->first_sample_flags_present_ = false;
  this->sample_duration_present_ = false;
  this->sample_size_present_ = false;
  this->sample_flags_present_ = false;
  this->sample_composition_time_offsets_present_ = false;
  return;
}

Assistant:

void zero_set() 
		{
			sample_count_=0;

			// optional fields
			data_offset_=0;
			first_sample_flags_=0;

			//flags
			data_offset_present_= false;
			first_sample_flags_present_ = false;
			sample_duration_present_ = false;
			sample_size_present_= false;
			sample_flags_present_= false;
			sample_composition_time_offsets_present_ = false;
		}